

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                begin,__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      end,anon_class_8_1_8991fb9c comp)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  pointer piVar10;
  pointer piVar11;
  pair<int,_int> pVar12;
  int iVar13;
  pair<int,_int> *ppVar14;
  long lVar15;
  pair<int,_int> *ppVar16;
  int iVar17;
  pair<int,_int> *ppVar18;
  long lVar19;
  ulong uVar20;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var21;
  ulong uVar22;
  pair<int,_int> *ppVar23;
  long lVar24;
  long lVar25;
  int local_70;
  ulong local_40;
  
  if ((begin._M_current != end._M_current) && (begin._M_current + 1 != end._M_current)) {
    piVar10 = ((comp.this)->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar11 = ((comp.this)->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar25 = 0;
    local_40 = 0;
    ppVar23 = begin._M_current + 1;
    _Var21._M_current = begin._M_current;
    do {
      ppVar18 = ppVar23;
      uVar1 = _Var21._M_current[1].first;
      uVar2 = _Var21._M_current[1].second;
      uVar3 = (_Var21._M_current)->first;
      iVar17 = piVar11[(int)uVar2];
      iVar4 = piVar10[(int)uVar1];
      iVar8 = iVar4;
      if (iVar17 < iVar4) {
        iVar8 = iVar17;
      }
      uVar5 = (_Var21._M_current)->second;
      iVar6 = piVar11[(int)uVar5];
      iVar7 = piVar10[(int)uVar3];
      iVar9 = iVar7;
      if (iVar6 < iVar7) {
        iVar9 = iVar6;
      }
      if ((iVar8 == 2) && (iVar9 != 2)) {
LAB_0031e46e:
        pVar12 = _Var21._M_current[1];
        _Var21._M_current[1].first = uVar3;
        ppVar18->second = (_Var21._M_current)->second;
        iVar17 = pVar12.first;
        local_70 = pVar12.second;
        ppVar23 = ppVar18;
        _Var21._M_current = begin._M_current;
        if (ppVar18 + -1 != begin._M_current) {
          uVar22 = (((ulong)pVar12 >> 0x20) + 0x80c8963be3e4c2f3) *
                   (((ulong)pVar12 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
                   (((ulong)pVar12 >> 0x20) + 0x8a183895eeac1536) *
                   (((ulong)pVar12 & 0xffffffff) + 0x42d8680e260ae5b);
          lVar15 = lVar25;
          ppVar14 = ppVar18 + -1;
          do {
            ppVar16 = ppVar14;
            uVar1 = ppVar16[-1].first;
            iVar4 = piVar11[(long)pVar12 >> 0x20];
            iVar8 = piVar10[iVar17];
            iVar6 = iVar8;
            if (iVar4 < iVar8) {
              iVar6 = iVar4;
            }
            uVar2 = ppVar16[-1].second;
            iVar7 = piVar11[(int)uVar2];
            iVar9 = piVar10[(int)uVar1];
            iVar13 = iVar9;
            if (iVar7 < iVar9) {
              iVar13 = iVar7;
            }
            if ((iVar6 != 2) || (iVar13 == 2)) {
              _Var21._M_current = ppVar16;
              if ((iVar6 != 2) && (iVar13 == 2)) break;
              lVar19 = (long)iVar8 * (long)iVar4;
              lVar24 = (long)iVar9 * (long)iVar7;
              if (lVar24 <= lVar19) {
                if (lVar19 - lVar24 != 0 && lVar24 <= lVar19) break;
                if (iVar13 <= iVar6) {
                  if (iVar13 < iVar6) break;
                  uVar20 = ((ulong)uVar2 + 0x80c8963be3e4c2f3) * ((ulong)uVar1 + 0xc8497d2a400d9551)
                           >> 0x20 ^ ((ulong)uVar2 + 0x8a183895eeac1536) *
                                     ((ulong)uVar1 + 0x42d8680e260ae5b);
                  if (uVar20 <= uVar22) {
                    if (uVar20 < uVar22) break;
                    if (((int)uVar1 <= iVar17) &&
                       (((int)uVar1 < iVar17 || ((int)uVar2 <= local_70)))) {
                      ppVar23 = ppVar16 + 1;
                      break;
                    }
                  }
                }
              }
            }
            ppVar16->first = uVar1;
            ppVar16->second = uVar2;
            lVar15 = lVar15 + 8;
            ppVar14 = ppVar16 + -1;
            ppVar23 = ppVar16;
            _Var21._M_current = begin._M_current;
          } while (lVar15 != 0);
        }
        (_Var21._M_current)->first = iVar17;
        ppVar23[-1].second = local_70;
        local_40 = local_40 + ((long)ppVar18 - (long)_Var21._M_current >> 3);
        if (8 < local_40) {
          return false;
        }
      }
      else if ((iVar8 == 2) || (iVar9 != 2)) {
        lVar15 = (long)iVar4 * (long)iVar17;
        lVar19 = (long)iVar7 * (long)iVar6;
        if (lVar15 < lVar19) goto LAB_0031e46e;
        if (lVar15 - lVar19 == 0 || lVar15 < lVar19) {
          if (iVar8 < iVar9) goto LAB_0031e46e;
          if (iVar8 <= iVar9) {
            uVar22 = ((ulong)uVar2 + 0x80c8963be3e4c2f3) * ((ulong)uVar1 + 0xc8497d2a400d9551) >>
                     0x20 ^ ((ulong)uVar2 + 0x8a183895eeac1536) * ((ulong)uVar1 + 0x42d8680e260ae5b)
            ;
            uVar20 = ((ulong)uVar5 + 0x80c8963be3e4c2f3) * ((ulong)uVar3 + 0xc8497d2a400d9551) >>
                     0x20 ^ ((ulong)uVar5 + 0x8a183895eeac1536) * ((ulong)uVar3 + 0x42d8680e260ae5b)
            ;
            if ((uVar22 < uVar20) ||
               ((uVar22 <= uVar20 &&
                (((int)uVar1 < (int)uVar3 || ((int)uVar2 < (int)uVar5 && (int)uVar1 <= (int)uVar3)))
                ))) goto LAB_0031e46e;
          }
        }
      }
      lVar25 = lVar25 + -8;
      ppVar23 = ppVar18 + 1;
      _Var21._M_current = ppVar18;
    } while (ppVar18 + 1 != end._M_current);
  }
  return true;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }